

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_mqtt_common.c
# Opt level: O2

IOTHUB_CLIENT_RESULT
IoTHubTransport_MQTT_Common_GetSendStatus
          (TRANSPORT_LL_HANDLE handle,IOTHUB_CLIENT_STATUS *iotHubClientStatus)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  IOTHUB_CLIENT_STATUS IVar3;
  IOTHUB_CLIENT_RESULT IVar4;
  
  if (handle == (TRANSPORT_LL_HANDLE)0x0 || iotHubClientStatus == (IOTHUB_CLIENT_STATUS *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      IVar4 = IOTHUB_CLIENT_INVALID_ARG;
    }
    else {
      IVar4 = IOTHUB_CLIENT_INVALID_ARG;
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                ,"IoTHubTransport_MQTT_Common_GetSendStatus",0xe81,1,"invalid argument.");
    }
  }
  else {
    iVar1 = DList_IsListEmpty(*(PDLIST_ENTRY *)((long)handle + 200));
    if (iVar1 == 0) {
      IVar3 = IOTHUB_CLIENT_SEND_STATUS_BUSY;
    }
    else {
      iVar1 = DList_IsListEmpty((PDLIST_ENTRY)((long)handle + 0xf8));
      IVar3 = (IOTHUB_CLIENT_STATUS)(iVar1 == 0);
    }
    *iotHubClientStatus = IVar3;
    IVar4 = IOTHUB_CLIENT_OK;
  }
  return IVar4;
}

Assistant:

IOTHUB_CLIENT_RESULT IoTHubTransport_MQTT_Common_GetSendStatus(TRANSPORT_LL_HANDLE handle, IOTHUB_CLIENT_STATUS *iotHubClientStatus)
{
    IOTHUB_CLIENT_RESULT result;

    if (handle == NULL || iotHubClientStatus == NULL)
    {
        LogError("invalid argument.");
        result = IOTHUB_CLIENT_INVALID_ARG;
    }
    else
    {
        MQTTTRANSPORT_HANDLE_DATA* handleData = (MQTTTRANSPORT_HANDLE_DATA*)handle;
        if (!DList_IsListEmpty(handleData->waitingToSend) || !DList_IsListEmpty(&(handleData->telemetry_waitingForAck)))
        {
            *iotHubClientStatus = IOTHUB_CLIENT_SEND_STATUS_BUSY;
        }
        else
        {
            *iotHubClientStatus = IOTHUB_CLIENT_SEND_STATUS_IDLE;
        }
        result = IOTHUB_CLIENT_OK;
    }
    return result;
}